

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O3

string * __thiscall
jaegertracing::Span::operationName_abi_cxx11_(string *__return_storage_ptr__,Span *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(this + 0x148));
  if (iVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(this + 200),
               *(long *)(this + 0xd0) + *(long *)(this + 200));
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0x148));
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

std::string operationName() const
    {
        std::lock_guard<std::mutex> lock(_mutex);
        return _operationName;
    }